

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O2

void anon_unknown.dwarf_5ee8b6::RawLogVA
               (LogSeverity severity,char *file,int line,char *format,__va_list_tag *ap)

{
  char cVar1;
  int iVar2;
  size_t len;
  int iVar3;
  char *pcVar4;
  int size;
  char *buf;
  char buffer [3000];
  uint local_bf4;
  char *local_bf0;
  char local_be8 [3000];
  
  local_bf0 = local_be8;
  local_bf4 = 3000;
  if (log_prefix_hook.hook_._M_b._M_p ==
      (__base_type)
      absl::base_internal::
      AtomicHook<bool_(*)(absl::LogSeverity,_const_char_*,_int,_char_**,_int_*)>::DummyFunction ||
      log_prefix_hook.hook_._M_b._M_p == (__pointer_type)0x0) {
    if ((int)severity < 1) {
      return;
    }
    DoRawLog(&local_bf0,(int *)&local_bf4,"[%s : %d] RAW: ",file,(ulong)(uint)line);
  }
  else {
    cVar1 = (*(code *)log_prefix_hook.hook_._M_b._M_p)(severity,file,line,&local_bf0,&local_bf4);
    pcVar4 = local_bf0;
    if (cVar1 == '\0') goto LAB_0026502f;
  }
  pcVar4 = local_bf0;
  iVar2 = vsnprintf(local_bf0,(long)(int)local_bf4,format,ap);
  iVar3 = local_bf4 - 0x1a;
  if (local_bf4 < 0x1a) {
    iVar3 = 0;
  }
  if (iVar2 <= (int)local_bf4 && iVar2 >= 0) {
    iVar3 = iVar2;
  }
  local_bf0 = local_bf0 + iVar3;
  if ((int)local_bf4 < iVar2 || iVar2 < 0) {
    local_bf4 = local_bf4 - iVar3;
    DoRawLog(&local_bf0,(int *)&local_bf4,"%s"," ... (message truncated)\n");
  }
  else {
    local_bf4 = local_bf4 - iVar3;
    DoRawLog(&local_bf0,(int *)&local_bf4,"\n");
  }
  len = strlen(local_be8);
  absl::raw_logging_internal::SafeWriteToStderr(local_be8,len);
LAB_0026502f:
  if (severity != kFatal) {
    return;
  }
  (*(code *)abort_hook.hook_._M_b._M_p)(file,line,local_be8,pcVar4,&stack0xffffffffffffffd0);
  abort();
}

Assistant:

void RawLogVA(absl::LogSeverity severity, const char* file, int line,
              const char* format, va_list ap) {
  char buffer[kLogBufSize];
  char* buf = buffer;
  int size = sizeof(buffer);
#ifdef ABSL_LOW_LEVEL_WRITE_SUPPORTED
  bool enabled = true;
#else
  bool enabled = false;
#endif

#ifdef ABSL_MIN_LOG_LEVEL
  if (static_cast<int>(severity) < ABSL_MIN_LOG_LEVEL &&
      severity < absl::LogSeverity::kFatal) {
    enabled = false;
  }
#endif

  auto log_prefix_hook_ptr = log_prefix_hook.Load();
  if (log_prefix_hook_ptr) {
    enabled = log_prefix_hook_ptr(severity, file, line, &buf, &size);
  } else {
    if (enabled) {
      DoRawLog(&buf, &size, "[%s : %d] RAW: ", file, line);
    }
  }
  const char* const prefix_end = buf;

#ifdef ABSL_LOW_LEVEL_WRITE_SUPPORTED
  if (enabled) {
    bool no_chop = VADoRawLog(&buf, &size, format, ap);
    if (no_chop) {
      DoRawLog(&buf, &size, "\n");
    } else {
      DoRawLog(&buf, &size, "%s", kTruncated);
    }
    absl::raw_logging_internal::SafeWriteToStderr(buffer, strlen(buffer));
  }
#else
  static_cast<void>(format);
  static_cast<void>(ap);
#endif

  // Abort the process after logging a FATAL message, even if the output itself
  // was suppressed.
  if (severity == absl::LogSeverity::kFatal) {
    abort_hook(file, line, buffer, prefix_end, buffer + kLogBufSize);
    abort();
  }
}